

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  GLFWwindow *pGVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  undefined4 uVar9;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    uVar4 = 0;
    glfwWindowHint(0x20004,0);
    piVar8 = &titles_rel;
    while( true ) {
      if (uVar4 == 4) {
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          glfwShowWindow(windows[lVar5]);
        }
        bVar1 = true;
        while (bVar1) {
          bVar1 = true;
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            pGVar3 = windows[lVar5];
            glfwMakeContextCurrent(pGVar3);
            glClear(0x4000);
            glfwSwapBuffers(pGVar3);
            iVar2 = glfwWindowShouldClose(pGVar3);
            if (iVar2 != 0) {
              bVar1 = false;
            }
          }
          glfwPollEvents();
        }
        glfwTerminate();
        exit(0);
      }
      pGVar3 = glfwCreateWindow(200,200,(char *)((long)&titles_rel + (long)*piVar8),
                                (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      windows[uVar4] = pGVar3;
      if (pGVar3 == (GLFWwindow *)0x0) break;
      glfwSetKeyCallback(pGVar3,key_callback);
      glfwMakeContextCurrent(pGVar3);
      uVar9 = 0x3f800000;
      if (uVar4 != 0) {
        uVar9 = 0;
      }
      uVar7 = (uint)uVar4 & 1;
      uVar6 = (uint)(uVar4 >> 1) & 0x7fffffff;
      glClearColor((float)uVar7,(float)uVar6,uVar9,0);
      glfwGetWindowFrameSize(pGVar3,&left,&top,&right,&bottom);
      glfwSetWindowPos(pGVar3,(left + right + 200) * uVar7 + 100,(top + bottom + 200) * uVar6 + 100)
      ;
      uVar4 = uVar4 + 1;
      piVar8 = piVar8 + 1;
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLboolean running = GL_TRUE;
    GLFWwindow* windows[4];

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        glClearColor((GLclampf) (i & 1),
                     (GLclampf) (i >> 1),
                     i ? 0.f : 1.f,
                     0.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GL_FALSE;
        }

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}